

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

void __thiscall
chaiscript::detail::Dispatch_State::Dispatch_State(Dispatch_State *this,Dispatch_Engine *t_engine)

{
  Stack_Holder *pSVar1;
  Conversion_Saves *pCVar2;
  
  (this->m_engine)._M_data = t_engine;
  pSVar1 = threading::Thread_Storage<chaiscript::detail::Stack_Holder>::operator*
                     (&t_engine->m_stack_holder);
  (this->m_stack_holder)._M_data = pSVar1;
  pCVar2 = threading::Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::operator*
                     (&(t_engine->m_conversions).m_conversion_saves);
  (this->m_conversions).m_conversions._M_data = &t_engine->m_conversions;
  (this->m_conversions).m_saves._M_data = pCVar2;
  return;
}

Assistant:

explicit Dispatch_State(Dispatch_Engine &t_engine)
          : m_engine(t_engine)
          , m_stack_holder(t_engine.get_stack_holder())
          , m_conversions(t_engine.conversions(), t_engine.conversions().conversion_saves()) {
      }